

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O0

cmJSONHelper<cm::optional<ShowOnlyEnum>,_cmCMakePresetsGraph::ReadFileResult> * __thiscall
cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
Optional<cmCMakePresetsGraph::TestPreset::ExecutionOptions::ShowOnlyEnum,cmCMakePresetsGraph::ReadFileResult(*)(cmCMakePresetsGraph::TestPreset::ExecutionOptions::ShowOnlyEnum&,Json::Value_const*)>
          (cmJSONHelper<cm::optional<ShowOnlyEnum>,_cmCMakePresetsGraph::ReadFileResult>
           *__return_storage_ptr__,cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult> *this,
          ReadFileResult success,_func_ReadFileResult_ShowOnlyEnum_ptr_Value_ptr *func)

{
  undefined4 in_register_00000014;
  anon_class_16_2_05117e18 local_30;
  _func_ReadFileResult_ShowOnlyEnum_ptr_Value_ptr *local_20;
  _func_ReadFileResult_ShowOnlyEnum_ptr_Value_ptr *func_local;
  cmJSONHelper<cm::optional<ShowOnlyEnum>,_cmCMakePresetsGraph::ReadFileResult> *pcStack_10;
  ReadFileResult success_local;
  
  local_30.success = (ReadFileResult)this;
  local_30.func =
       (_func_ReadFileResult_ShowOnlyEnum_ptr_Value_ptr *)CONCAT44(in_register_00000014,success);
  local_20 = local_30.func;
  func_local._4_4_ = local_30.success;
  pcStack_10 = __return_storage_ptr__;
  std::
  function<cmCMakePresetsGraph::ReadFileResult(std::optional<cmCMakePresetsGraph::TestPreset::ExecutionOptions::ShowOnlyEnum>&,Json::Value_const*)>
  ::
  function<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Optional<cmCMakePresetsGraph::TestPreset::ExecutionOptions::ShowOnlyEnum,cmCMakePresetsGraph::ReadFileResult(*)(cmCMakePresetsGraph::TestPreset::ExecutionOptions::ShowOnlyEnum&,Json::Value_const*)>(cmCMakePresetsGraph::ReadFileResult,cmCMakePresetsGraph::ReadFileResult(*)(cmCMakePresetsGraph::TestPreset::ExecutionOptions::ShowOnlyEnum&,Json::Value_const*))::_lambda(std::optional<cmCMakePresetsGraph::TestPreset::ExecutionOptions::ShowOnlyEnum>&,Json::Value_const*)_1_,void>
            ((function<cmCMakePresetsGraph::ReadFileResult(std::optional<cmCMakePresetsGraph::TestPreset::ExecutionOptions::ShowOnlyEnum>&,Json::Value_const*)>
              *)__return_storage_ptr__,&local_30);
  return __return_storage_ptr__;
}

Assistant:

static cmJSONHelper<cm::optional<T>, E, CallState...> Optional(E success,
                                                                 F func)
  {
    return [success, func](cm::optional<T>& out, const Json::Value* value,
                           CallState&&... state) -> E {
      if (!value) {
        out.reset();
        return success;
      }
      out.emplace();
      return func(*out, value, std::forward(state)...);
    };
  }